

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::fedRegistration(CoreBroker *this,ActionMessage *command)

{
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *pDVar1;
  uint16_t uVar2;
  ushort uVar3;
  GlobalFederateId federateID;
  size_t sVar4;
  byte *pbVar5;
  pointer pBVar6;
  BaseTimeCoordinator *pBVar7;
  pointer pcVar8;
  size_type sVar9;
  string_view message;
  string_view searchValue;
  string_view searchValue_00;
  string_view name;
  int32_t errorCode;
  bool bVar10;
  int iVar11;
  route_id rVar12;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var13;
  size_t index;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view searchValue_01;
  string_view searchValue_02;
  string_view fmt;
  format_args args;
  string_view name_00;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>,_bool>
  pVar14;
  int32_t iStackY_200;
  GlobalFederateId global_fedid;
  route_id route_id;
  string_view fedName;
  string local_1c0;
  ActionMessage noInit;
  ActionMessage fedEnableProfiling;
  
  if ((this->super_BrokerBase).field_0x295 == '\0') {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>(&this->earlyMessages,command);
    return;
  }
  uVar2 = command->flags;
  if ((short)uVar2 < 0) {
    if ((this->super_BrokerBase).brokerState._M_i < OPERATING) goto LAB_002c263a;
LAB_002c2604:
    if ((this->super_BrokerBase).brokerState._M_i != OPERATING) {
      iStackY_200 = 0xe;
LAB_002c261d:
      sendFedErrorAck(this,command,iStackY_200);
      return;
    }
    bVar10 = true;
    if (((-1 < (short)uVar2) && ((this->super_BrokerBase).dynamicFederation == false)) &&
       ((command->flags & 0x100) == 0)) {
      iStackY_200 = 5;
      goto LAB_002c261d;
    }
  }
  else {
    iVar11 = getCountableFederates(this);
    if ((this->super_BrokerBase).maxFederateCount <= iVar11) {
      iStackY_200 = 0xb;
      goto LAB_002c261d;
    }
    if (INITIALIZING < (this->super_BrokerBase).brokerState._M_i) goto LAB_002c2604;
    bVar10 = allInitReady(this);
    if (bVar10) {
      ActionMessage::ActionMessage(&noInit,cmd_init_not_ready);
      noInit.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,&noInit);
      ActionMessage::~ActionMessage(&noInit);
    }
LAB_002c263a:
    bVar10 = false;
  }
  sVar4 = (command->payload).bufferSize;
  pbVar5 = (command->payload).heap;
  if ((bVar10 == false) || ((command->flags & 0x400) == 0)) {
LAB_002c2723:
    pDVar1 = &this->mFederates;
    searchValue_02._M_str = (char *)pbVar5;
    searchValue_02._M_len = sVar4;
    _Var13 = gmlc::containers::
             DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
             ::find(pDVar1,searchValue_02);
    if (_Var13._M_current ==
        (this->mFederates).dataStorage.
        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      gmlc::containers::
      DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
      ::insert<std::basic_string_view<char,std::char_traits<char>>&>
                ((DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
                  *)pDVar1,sVar4,pbVar5);
      rVar12 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
      pBVar6 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pBVar6[-1].route.rid = rVar12.rid;
      pBVar6[-1].parent.gid = (command->source_id).gid;
      uVar3 = command->flags;
      if ((short)uVar3 < 0) {
        pBVar6[-1].nonCounting = true;
      }
      if ((uVar3 >> 8 & 1) != 0) {
        pBVar6[-1].observer = true;
      }
      if ((uVar3 >> 10 & 1) != 0) {
        pBVar6[-1].reentrant = true;
      }
      pBVar6[-1].dynamic = bVar10;
      index = ((long)pBVar6 -
              (long)(pDVar1->dataStorage).
                    super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x38 - 1;
      if ((uVar3 >> 0xe & 1) == 0) {
        if ((this->super_BrokerBase).field_0x294 == '\x01') {
          iVar11 = 0;
          if ((ushort)(command->counter - 1) < 0x10) {
            iVar11 = (uint)command->counter * 100000000;
          }
          pBVar6[-1].global_id.gid = (int)index + iVar11 + 0x20000;
          gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
          ::addSearchTermForIndex(pDVar1,&pBVar6[-1].global_id,index);
        }
      }
      else {
        pBVar6[-1].global_id.gid = (command->dest_handle).hid;
        bVar10 = gmlc::containers::
                 DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                 ::addSearchTermForIndex(pDVar1,&pBVar6[-1].global_id,index);
        if (!bVar10) {
          errorCode = 0x11;
          goto LAB_002c273d;
        }
      }
      if ((this->super_BrokerBase).field_0x294 == '\0') {
LAB_002c2a87:
        iVar11 = (this->super_BrokerBase).global_broker_id_local.gid;
        if ((iVar11 != -2010000000) && (iVar11 != -1700000000)) {
          (command->source_id).gid = iVar11;
          (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
          return;
        }
        gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::
        push<helics::ActionMessage&>
                  ((SimpleQueue<helics::ActionMessage,std::mutex> *)&this->delayTransmitQueue,
                   command);
        return;
      }
      pBVar6 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      route_id.rid = pBVar6[-1].route.rid;
      _Var13._M_current = pBVar6 + -1;
      bVar10 = true;
LAB_002c2846:
      global_fedid.gid = ((_Var13._M_current)->global_id).gid;
      pVar14 = std::
               _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<helics::GlobalFederateId&,helics::route_id&>
                         ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->routing_table,&global_fedid,&route_id);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0 && !bVar10) {
        *(BaseType *)
         ((long)pVar14.first.
                super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
         + 0xc) = route_id.rid;
      }
      ActionMessage::ActionMessage(&noInit,cmd_fed_ack);
      noInit.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      noInit.dest_id = global_fedid;
      name._M_str = (char *)pbVar5;
      name._M_len = sVar4;
      ActionMessage::name(&noInit,name);
      if ((command->flags >> 0xe & 1) != 0) {
        noInit.flags = noInit.flags | 0x4000;
      }
      bVar10 = (this->super_BrokerBase).asyncTime;
      if ((((this->super_BrokerBase).globalTime != false) || ((bVar10 & 1U) != 0)) &&
         (noInit.flags = (bVar10 & 1) << 7 | noInit.flags | 0x20, -1 < (short)command->flags)) {
        pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar7->_vptr_BaseTimeCoordinator[4])(pBVar7,(ulong)(uint)global_fedid.gid);
        pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar7->_vptr_BaseTimeCoordinator[5])(pBVar7,(ulong)(uint)global_fedid.gid);
        BaseTimeCoordinator::setAsChild
                  ((this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                   global_fedid);
      }
      if ((this->super_BrokerBase).globalDisconnect == true) {
        noInit.flags = noInit.flags | 0x800;
      }
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)route_id.rid,&noInit);
      if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar8 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar9 = (this->super_BrokerBase).identifier._M_string_length;
        fedEnableProfiling.dest_id = global_fedid;
        fedEnableProfiling.actionTime.internalTimeCode._0_4_ = route_id.rid;
        fmt.size_ = 0x11d;
        fmt.data_ = (char *)0x27;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&fedEnableProfiling;
        fedEnableProfiling._0_8_ = pbVar5;
        fedEnableProfiling._8_8_ = sVar4;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_1c0,(v11 *)"registering federate {}({}) on route {}",fmt,args);
        message._M_str = local_1c0._M_dataplus._M_p;
        message._M_len = local_1c0._M_string_length;
        name_00._M_str = pcVar8;
        name_00._M_len = sVar9;
        BrokerBase::sendToLogger(&this->super_BrokerBase,federateID,9,name_00,message,false);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      if ((this->super_BrokerBase).enable_profiling == true) {
        ActionMessage::ActionMessage
                  (&fedEnableProfiling,cmd_set_profiler_flag,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   global_fedid);
        fedEnableProfiling.flags._0_1_ = (byte)fedEnableProfiling.flags | 0x20;
        (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)route_id.rid);
        ActionMessage::~ActionMessage(&fedEnableProfiling);
      }
      if ((this->mNextTimeBarrier).internalTimeCode != 0x7fffffffffffffff) {
        ActionMessage::ActionMessage
                  (&fedEnableProfiling,cmd_time_barrier,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   global_fedid);
        fedEnableProfiling.actionTime.internalTimeCode = (this->mNextTimeBarrier).internalTimeCode;
        fedEnableProfiling.messageID = (this->super_BrokerBase).global_broker_id_local.gid;
        (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)route_id.rid);
        ActionMessage::~ActionMessage(&fedEnableProfiling);
      }
      ActionMessage::~ActionMessage(&noInit);
      return;
    }
  }
  else {
    pDVar1 = &this->mFederates;
    searchValue_01._M_str = (char *)pbVar5;
    searchValue_01._M_len = sVar4;
    _Var13 = gmlc::containers::
             DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
             ::find(pDVar1,searchValue_01);
    if (_Var13._M_current ==
        (this->mFederates).dataStorage.
        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_002c2723;
    if ((_Var13._M_current)->reentrant != false) {
      rVar12 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
      ((_Var13._M_current)->route).rid = rVar12.rid;
      ((_Var13._M_current)->parent).gid = (command->source_id).gid;
      (_Var13._M_current)->state = CONNECTED;
      if ((this->super_BrokerBase).field_0x294 == '\0') goto LAB_002c2a87;
      searchValue._M_str = (char *)pbVar5;
      searchValue._M_len = sVar4;
      _Var13 = gmlc::containers::
               DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
               ::find(pDVar1,searchValue);
      route_id.rid = ((_Var13._M_current)->route).rid;
      searchValue_00._M_str = (char *)pbVar5;
      searchValue_00._M_len = sVar4;
      _Var13 = gmlc::containers::
               DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
               ::find(pDVar1,searchValue_00);
      bVar10 = false;
      goto LAB_002c2846;
    }
  }
  errorCode = 6;
LAB_002c273d:
  sendFedErrorAck(this,command,errorCode);
  return;
}

Assistant:

void CoreBroker::fedRegistration(ActionMessage&& command)
{
    if (!connectionEstablished) {
        earlyMessages.push_back(std::move(command));
        return;
    }
    const bool countable = !checkActionFlag(command, non_counting_flag);
    bool dynamicFed{false};
    if (countable && getCountableFederates() >= maxFederateCount) {
        sendFedErrorAck(command, max_federate_count_exceeded);
        return;
    }
    if (getBrokerState() < BrokerState::OPERATING) {
        if (countable && allInitReady()) {
            ActionMessage noInit(CMD_INIT_NOT_READY);
            noInit.source_id = global_broker_id_local;
            transmit(parent_route_id, noInit);
        }
    } else if (getBrokerState() == BrokerState::OPERATING) {
        const bool allowed =
            dynamicFederation || !countable || checkActionFlag(command, observer_flag);
        if (!allowed) {
            // we are initialized already
            sendFedErrorAck(command, already_init_error_code);
            return;
        }
        dynamicFed = true;
    } else {
        // we are in an ERROR_STATE and terminating
        sendFedErrorAck(command, broker_terminating);
        return;
    }
    auto fedName = command.name();
    bool newFed{true};
    if (dynamicFed && checkActionFlag(command, reentrant_flag)) {
        auto fedLoc = mFederates.find(fedName);
        if (fedLoc != mFederates.end()) {
            if (fedLoc->reentrant) {
                fedLoc->route = getRoute(command.source_id);
                fedLoc->parent = command.source_id;
                fedLoc->state = ConnectionState::CONNECTED;
                newFed = false;
            } else {
                sendFedErrorAck(command, duplicate_federate_name_error_code);
                return;
            }
        }
    }

    if (newFed) {
        // this checks for duplicate federate names
        if (mFederates.find(fedName) != mFederates.end()) {
            sendFedErrorAck(command, duplicate_federate_name_error_code);
            return;
        }
        mFederates.insert(fedName, no_search, fedName);
        mFederates.back().route = getRoute(command.source_id);
        mFederates.back().parent = command.source_id;
        if (checkActionFlag(command, non_counting_flag)) {
            mFederates.back().nonCounting = true;
        }
        if (checkActionFlag(command, observer_flag)) {
            mFederates.back().observer = true;
        }
        if (checkActionFlag(command, reentrant_flag)) {
            mFederates.back().reentrant = true;
        }
        mFederates.back().dynamic = dynamicFed;
        auto lookupIndex = mFederates.size() - 1;
        if (checkActionFlag(command, child_flag)) {
            mFederates.back().global_id = GlobalFederateId(command.getExtraData());
            if (!mFederates.addSearchTermForIndex(mFederates.back().global_id, lookupIndex)) {
                sendFedErrorAck(command, duplicate_federate_id);
                return;
            }
        } else if (isRootc) {
            if (command.counter > 0 && command.counter <= 16) {
                mFederates.back().global_id = GlobalFederateId(
                    static_cast<GlobalFederateId::BaseType>(lookupIndex) + gGlobalFederateIdShift +
                    command.counter * gGlobalPriorityBlockSize);
            } else {
                mFederates.back().global_id = GlobalFederateId(
                    static_cast<GlobalFederateId::BaseType>(lookupIndex) + gGlobalFederateIdShift);
            }
            mFederates.addSearchTermForIndex(mFederates.back().global_id, lookupIndex);
        }
    }

    if (!isRootc) {
        if (global_broker_id_local.isValid()) {
            command.source_id = global_broker_id_local;
            transmit(parent_route_id, command);
        } else {
            // delay the response if we are not fully registered yet
            delayTransmitQueue.push(command);
        }
    } else {
        auto route_id = (newFed) ? mFederates.back().route : mFederates.find(fedName)->route;
        auto global_fedid =
            (newFed) ? mFederates.back().global_id : mFederates.find(fedName)->global_id;
        auto res = routing_table.emplace(global_fedid, route_id);
        if (!res.second && !newFed) {
            res.first->second = route_id;
        }

        // don't bother with the federate_table
        // transmit the response
        ActionMessage fedReply(CMD_FED_ACK);
        fedReply.source_id = global_broker_id_local;
        fedReply.dest_id = global_fedid;
        fedReply.name(fedName);
        if (checkActionFlag(command, child_flag)) {
            setActionFlag(fedReply, child_flag);
        }
        if (globalTime || asyncTime) {
            setActionFlag(fedReply, global_timing_flag);
            if (asyncTime) {
                setActionFlag(fedReply, async_timing_flag);
            }
            if (!checkActionFlag(command, non_counting_flag)) {
                timeCoord->addDependency(global_fedid);
                timeCoord->addDependent(global_fedid);
                timeCoord->setAsChild(global_fedid);
            }
        }
        if (globalDisconnect) {
            setActionFlag(fedReply, global_disconnect_flag);
        }
        transmit(route_id, fedReply);
        LOG_CONNECTIONS(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("registering federate {}({}) on route {}",
                                    fedName,
                                    global_fedid.baseValue(),
                                    route_id.baseValue()));
        if (enable_profiling) {
            ActionMessage fedEnableProfiling(CMD_SET_PROFILER_FLAG,
                                             global_broker_id_local,
                                             global_fedid);
            setActionFlag(fedEnableProfiling, indicator_flag);
            transmit(route_id, fedEnableProfiling);
        }
        if (mNextTimeBarrier < Time::maxVal()) {
            ActionMessage timeBarrier(CMD_TIME_BARRIER, global_broker_id_local, global_fedid);
            timeBarrier.actionTime = mNextTimeBarrier;
            timeBarrier.messageID = global_broker_id_local.baseValue();
            transmit(route_id, timeBarrier);
        }
    }
}